

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O1

QString * __thiscall QLibrary::fileName(QString *__return_storage_ptr__,QLibrary *this)

{
  __pointer_type copy;
  Data *pDVar1;
  long lVar2;
  ulong uVar3;
  QBasicMutex *this_00;
  bool bVar4;
  
  uVar3 = (this->d).d;
  if (uVar3 < 8) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
  uVar3 = uVar3 & 0xfffffffffffffff8;
  this_00 = (QBasicMutex *)(uVar3 + 0x40);
  if (*(long *)(uVar3 + 0x40) == 0) {
    LOCK();
    bVar4 = (this_00->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar4) {
      (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar4) goto LAB_004a474a;
  }
  QBasicMutex::lockInternal(this_00);
LAB_004a474a:
  uVar3 = (this->d).d & 0xfffffffffffffff8;
  lVar2 = 0x88;
  if (*(long *)(uVar3 + 0x98) == 0) {
    lVar2 = 0;
  }
  pDVar1 = *(Data **)(uVar3 + lVar2);
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = *(char16_t **)(uVar3 + 8 + lVar2);
  (__return_storage_ptr__->d).size = *(qsizetype *)(uVar3 + 0x10 + lVar2);
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  LOCK();
  copy = (this_00->d_ptr)._q_value._M_b._M_p;
  (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(this_00,copy);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QLibrary::fileName() const
{
    if (d) {
        QMutexLocker locker(&d->mutex);
        return d->qualifiedFileName.isEmpty() ? d->fileName : d->qualifiedFileName;
    }
    return QString();
}